

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O2

int __thiscall ON_BinaryArchive::GetCurrentChunk(ON_BinaryArchive *this,ON_3DM_CHUNK *chunk)

{
  ON__UINT8 OVar1;
  ON__UINT8 OVar2;
  ON__UINT8 OVar3;
  int iVar4;
  uint uVar5;
  ON__UINT32 OVar6;
  ON_3DM_BIG_CHUNK *pOVar7;
  ON__UINT64 u64;
  undefined8 in_RAX;
  long lVar8;
  ON__INT32 i32;
  undefined8 local_38;
  
  chunk->m_do_length = 0;
  chunk->m_do_crc16 = 0;
  chunk->m_crc16 = 0;
  chunk->m_do_crc32 = 0;
  chunk->m_crc32 = 0;
  chunk->m_offset = 0;
  chunk->m_typecode = 0;
  chunk->m_value = 0;
  iVar4 = (this->m_chunk).m_count;
  lVar8 = (long)iVar4;
  if (0 < lVar8) {
    pOVar7 = (this->m_chunk).m_a;
    u64 = pOVar7[lVar8 + -1].m_big_value;
    uVar5 = pOVar7[lVar8 + -1].m_typecode;
    OVar1 = pOVar7[lVar8 + -1].m_bLongChunk;
    OVar2 = pOVar7[lVar8 + -1].m_do_crc16;
    OVar3 = pOVar7[lVar8 + -1].m_do_crc32;
    local_38 = CONCAT26(pOVar7[lVar8 + -1].m_crc16,(int6)in_RAX);
    OVar6 = pOVar7[lVar8 + -1].m_crc32;
    chunk->m_offset = pOVar7[lVar8 + -1].m_start_offset;
    chunk->m_typecode = uVar5;
    local_38 = local_38 & 0xffffffff00000000;
    if ((int)uVar5 < 0) {
      DownSizeINT(u64,(ON__INT32 *)&local_38);
    }
    else {
      DownSizeUINT(u64,(ON__UINT32 *)&local_38);
    }
    chunk->m_value = (ON__UINT32)local_38;
    chunk->m_do_length = (uint)(OVar1 != '\0');
    chunk->m_do_crc16 = (ushort)(OVar2 != '\0');
    chunk->m_do_crc32 = (uint)(OVar3 != '\0');
    chunk->m_crc16 = local_38._6_2_;
    chunk->m_crc32 = OVar6;
  }
  return iVar4;
}

Assistant:

int ON_BinaryArchive::GetCurrentChunk(ON_3DM_CHUNK& chunk) const
{
  ON_3DM_BIG_CHUNK big_chunk;
  memset(&chunk,0,sizeof(ON_3DM_CHUNK));
  memset(&big_chunk,0,sizeof(big_chunk));
  int rc = GetCurrentChunk(big_chunk);
  if ( rc > 0 )
  {
    chunk.m_offset = (size_t)big_chunk.m_start_offset;
    chunk.m_typecode = big_chunk.m_typecode;

    ON__INT32 i32 = 0;
    if ( ON_IsLongChunkTypecode( big_chunk.m_typecode ) )
      DownSizeUINT( (ON__UINT64)big_chunk.m_big_value, (ON__UINT32*)&i32 );
    else
      DownSizeINT( big_chunk.m_big_value, &i32 );
    chunk.m_value = i32;

    chunk.m_do_length = big_chunk.m_bLongChunk ? 1 : 0;
    chunk.m_do_crc16 = big_chunk.m_do_crc16 ? 1 : 0;
    chunk.m_do_crc32 = big_chunk.m_do_crc32 ? 1 : 0;
    chunk.m_crc16 = big_chunk.m_crc16;
    chunk.m_crc32 = big_chunk.m_crc32;
  }
  return rc;
}